

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_set_samples(bcf_hdr_t *hdr,char *samples,int is_file)

{
  bcf_idinfo_t *pbVar1;
  uint *__ptr;
  bcf_idinfo_t *pbVar2;
  int iVar3;
  uint uVar4;
  khint_t kVar5;
  uint8_t *puVar6;
  char **ppcVar7;
  char *pcVar8;
  kh_vdict_t *h;
  int iVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  int n;
  int ignore;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((samples == (char *)0x0) || (iVar3 = strcmp("-",samples), iVar3 != 0)) {
    iVar3 = hdr->n[2];
    hdr->nsamples_ori = iVar3;
    if (samples != (char *)0x0) {
      iVar9 = iVar3 + 7;
      if (-1 < iVar3) {
        iVar9 = iVar3;
      }
      puVar6 = (uint8_t *)calloc((long)((iVar9 >> 3) + 1),1);
      hdr->keep_samples = puVar6;
      if ((*samples == '^') && (0 < hdr->n[2])) {
        uVar4 = 0;
        do {
          hdr->keep_samples[uVar4 >> 3] =
               hdr->keep_samples[uVar4 >> 3] | (byte)(1 << ((byte)uVar4 & 7));
          uVar4 = uVar4 + 1;
        } while ((int)uVar4 < hdr->n[2]);
      }
      ppcVar7 = hts_readlist(samples + (*samples == '^'),is_file,&local_3c);
      if (ppcVar7 == (char **)0x0) {
        return -1;
      }
      if (local_3c < 1) {
        iVar3 = 0;
      }
      else {
        lVar13 = 0;
        iVar3 = 0;
        do {
          uVar4 = bcf_hdr_id2int(hdr,2,ppcVar7[lVar13]);
          if ((int)uVar4 < 0) {
            if (iVar3 == 0) {
              iVar3 = (int)lVar13 + 1;
            }
          }
          else {
            if (hdr->n[2] <= (int)uVar4) {
              __assert_fail("idx<bcf_hdr_nsamples(hdr)",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                            ,0x9a6,"int bcf_hdr_set_samples(bcf_hdr_t *, const char *, int)");
            }
            bVar12 = hdr->keep_samples[uVar4 >> 3];
            bVar11 = (byte)(1 << ((byte)uVar4 & 7));
            if (*samples == '^') {
              bVar12 = bVar12 & ~bVar11;
            }
            else {
              bVar12 = bVar12 | bVar11;
            }
            hdr->keep_samples[uVar4 >> 3] = bVar12;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < local_3c);
      }
      if (0 < local_3c) {
        lVar13 = 0;
        do {
          free(ppcVar7[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < local_3c);
      }
      free(ppcVar7);
      hdr->n[2] = 0;
      uVar4 = hdr->nsamples_ori;
      if (0 < (long)(int)uVar4) {
        puVar6 = hdr->keep_samples;
        uVar10 = 0;
        do {
          if ((puVar6[uVar10 >> 3] >> (uVar10 & 7) & 1) != 0) {
            hdr->n[2] = hdr->n[2] + 1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
      if ((long)hdr->n[2] != 0) {
        local_38 = iVar3;
        ppcVar7 = (char **)malloc((long)hdr->n[2] << 3);
        if (0 < (int)uVar4) {
          puVar6 = hdr->keep_samples;
          uVar14 = 0;
          iVar3 = 0;
          do {
            if ((puVar6[uVar14 >> 3 & 0x1fffffff] >> ((uint)uVar14 & 7) & 1) != 0) {
              pcVar8 = strdup(hdr->samples[uVar14]);
              lVar13 = (long)iVar3;
              iVar3 = iVar3 + 1;
              ppcVar7[lVar13] = pcVar8;
            }
            uVar14 = uVar14 + 1;
          } while ((long)(int)uVar4 != uVar14);
        }
        free(hdr->samples);
        iVar3 = local_38;
        hdr->samples = ppcVar7;
        __ptr = (uint *)hdr->dict[2];
        if (*__ptr != 0) {
          bVar12 = 0;
          uVar14 = 0;
          do {
            if ((*(uint *)(*(long *)(__ptr + 4) + (uVar14 >> 4 & 0xfffffff) * 4) >> (bVar12 & 0x1e)
                & 3) == 0) {
              free(*(void **)(*(long *)(__ptr + 6) + uVar14 * 8));
            }
            uVar14 = uVar14 + 1;
            bVar12 = bVar12 + 2;
          } while (uVar14 != *__ptr);
        }
        free(*(void **)(__ptr + 6));
        free(*(void **)(__ptr + 4));
        free(*(void **)(__ptr + 8));
        free(__ptr);
        h = (kh_vdict_t *)calloc(1,0x28);
        hdr->dict[2] = h;
        if (0 < hdr->n[2]) {
          lVar13 = 0;
          do {
            kVar5 = kh_put_vdict(h,hdr->samples[lVar13],&local_34);
            pbVar2 = h->vals;
            pbVar1 = pbVar2 + (int)kVar5;
            pbVar1->info[0] = 0xf;
            pbVar1->info[1] = 0xf;
            *(undefined8 *)(pbVar1->info + 2) = 0xf;
            pbVar2[(int)kVar5].hrec[0] = (bcf_hrec_t *)0x0;
            pbVar2[(int)kVar5].hrec[1] = (bcf_hrec_t *)0x0;
            pbVar2[(int)kVar5].hrec[2] = (bcf_hrec_t *)0x0;
            (pbVar2[(int)kVar5].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
            pbVar2[(int)kVar5].id = h->size - 1;
            lVar13 = lVar13 + 1;
          } while (lVar13 < hdr->n[2]);
        }
        bcf_hdr_sync(hdr);
        return iVar3;
      }
      free(hdr->keep_samples);
      hdr->keep_samples = (uint8_t *)0x0;
      return iVar3;
    }
    hdr->n[2] = 0;
  }
  return 0;
}

Assistant:

int bcf_hdr_set_samples(bcf_hdr_t *hdr, const char *samples, int is_file)
{
    if ( samples && !strcmp("-",samples) ) return 0;            // keep all samples

    hdr->nsamples_ori = bcf_hdr_nsamples(hdr);
    if ( !samples ) { bcf_hdr_nsamples(hdr) = 0; return 0; }    // exclude all samples

    int i, narr = bit_array_size(bcf_hdr_nsamples(hdr));
    hdr->keep_samples = (uint8_t*) calloc(narr,1);
    if ( samples[0]=='^' )
        for (i=0; i<bcf_hdr_nsamples(hdr); i++) bit_array_set(hdr->keep_samples,i);

    int idx, n, ret = 0;
    char **smpls = hts_readlist(samples[0]=='^'?samples+1:samples, is_file, &n);
    if ( !smpls ) return -1;
    for (i=0; i<n; i++)
    {
        idx = bcf_hdr_id2int(hdr,BCF_DT_SAMPLE,smpls[i]);
        if ( idx<0 )
        {
            if ( !ret ) ret = i+1;
            continue;
        }
        assert( idx<bcf_hdr_nsamples(hdr) );
        if (  samples[0]=='^' )
            bit_array_clear(hdr->keep_samples, idx);
        else
            bit_array_set(hdr->keep_samples, idx);
    }
    for (i=0; i<n; i++) free(smpls[i]);
    free(smpls);

    bcf_hdr_nsamples(hdr) = 0;
    for (i=0; i<hdr->nsamples_ori; i++)
        if ( bit_array_test(hdr->keep_samples,i) ) bcf_hdr_nsamples(hdr)++;
    if ( !bcf_hdr_nsamples(hdr) ) { free(hdr->keep_samples); hdr->keep_samples=NULL; }
    else
    {
        char **samples = (char**) malloc(sizeof(char*)*bcf_hdr_nsamples(hdr));
        idx = 0;
        for (i=0; i<hdr->nsamples_ori; i++)
            if ( bit_array_test(hdr->keep_samples,i) ) samples[idx++] = strdup(hdr->samples[i]);
        free(hdr->samples);
        hdr->samples = samples;

        // delete original samples from the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_SAMPLE];
        int k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);

        // add the subset back
        hdr->dict[BCF_DT_SAMPLE] = d = kh_init(vdict);
        for (i=0; i<bcf_hdr_nsamples(hdr); i++)
        {
            int ignore, k = kh_put(vdict, d, hdr->samples[i], &ignore);
            kh_val(d, k) = bcf_idinfo_def;
            kh_val(d, k).id = kh_size(d) - 1;
        }
        bcf_hdr_sync(hdr);
    }

    return ret;
}